

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetbios.c
# Opt level: O1

int nv_checksignature(uint8_t *data)

{
  ulong uVar1;
  
  if ((*data == 'U') && (data[1] == 0xaa)) {
    uVar1 = (ulong)*(ushort *)(data + 0x18);
    if ((((data[uVar1] == 'P') && (data[uVar1 + 1] == 'C')) && (data[uVar1 + 2] == 'I')) &&
       (data[uVar1 + 3] == 'R')) {
      return 1;
    }
    nv_checksignature_cold_2();
  }
  else {
    nv_checksignature_cold_1();
  }
  return -2;
}

Assistant:

static int nv_checksignature(const uint8_t *data)
{
	uint16_t pcir_ptr;

	/* bail if no rom signature */
	if (data[0] != 0x55 || data[1] != 0xaa) {
		fprintf(stderr, "Invalid signature(0x55aa). You may want to try another retrieval method.\n");
		return ESIG;
	}

	/* additional check (see note below) - read PCI record header */
	pcir_ptr = data[0x18] | data[0x19] << 8;
	if (data[pcir_ptr] != 'P' ||
	    data[pcir_ptr + 1] != 'C' ||
	    data[pcir_ptr + 2] != 'I' ||
	    data[pcir_ptr + 3] != 'R') {

		fprintf(stderr, "Invalid signature(PCIR). You may want to try another retrieval method.\n");
		return ESIG;
	}

	return EOK;
}